

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::outputInplace(FullyConnectedLayer *this,Array *inputs)

{
  element_type *this_00;
  size_t sVar1;
  Array *outputs;
  Array *inputs_local;
  FullyConnectedLayer *this_local;
  
  this_00 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ABackpropLayer).shared.outputBuffer);
  sVar1 = std::valarray<float>::size(this_00);
  if (sVar1 != this->nOutputs) {
    std::valarray<float>::resize(this_00,this->nOutputs,0.0);
  }
  rememberInputs(this,inputs);
  calcInducedLocalField(this,inputs);
  calcActivationGrad(this);
  calcOutput(this);
  return;
}

Assistant:

void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nOutputs) {
            outputs.resize(nOutputs);
        }
        rememberInputs(inputs);
        calcInducedLocalField(inputs);
        calcActivationGrad();
        calcOutput();
    }